

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

unsigned_long xmlHashComputeKey(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)table->random_seed;
  if (name != (xmlChar *)0x0) {
    uVar2 = (ulong)*name;
    uVar1 = uVar1 + uVar2 * 0x1e;
    while( true ) {
      name = name + 1;
      if ((char)uVar2 == '\0') break;
      uVar1 = uVar1 ^ (long)(char)uVar2 + (uVar1 >> 3) + uVar1 * 0x20;
      uVar2 = (ulong)*name;
    }
  }
  uVar1 = (uVar1 >> 3) + uVar1 * 0x20 ^ uVar1;
  if (name2 != (xmlChar *)0x0) {
    for (; (long)(char)*name2 != 0; name2 = name2 + 1) {
      uVar1 = uVar1 ^ (uVar1 >> 3) + uVar1 * 0x20 + (long)(char)*name2;
    }
  }
  uVar1 = (uVar1 >> 3) + uVar1 * 0x20 ^ uVar1;
  if (name3 != (xmlChar *)0x0) {
    for (; (long)(char)*name3 != 0; name3 = name3 + 1) {
      uVar1 = uVar1 ^ (uVar1 >> 3) + uVar1 * 0x20 + (long)(char)*name3;
    }
  }
  return uVar1 % (ulong)(long)table->size;
}

Assistant:

static unsigned long
xmlHashComputeKey(xmlHashTablePtr table, const xmlChar *name,
	          const xmlChar *name2, const xmlChar *name3) {
    unsigned long value = 0L;
    char ch;

#ifdef HASH_RANDOMIZATION
    value = table->random_seed;
#endif
    if (name != NULL) {
	value += 30 * (*name);
	while ((ch = *name++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (name2 != NULL) {
	while ((ch = *name2++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (name3 != NULL) {
	while ((ch = *name3++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    return (value % table->size);
}